

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O2

void process(lzma_check_state *check)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint32_t uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint32_t uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint local_f4;
  uint local_f0;
  uint local_ec;
  uint local_e8;
  uint local_e4;
  uint local_e0;
  uint local_dc;
  uint local_d0;
  uint local_cc;
  uint local_c4;
  uint local_c0;
  uint local_b4;
  uint local_ac;
  
  uVar1 = (check->state).crc32;
  uVar2 = (check->state).sha256.state[1];
  uVar3 = (check->state).sha256.state[2];
  uVar4 = (check->state).sha256.state[3];
  uVar5 = (check->state).sha256.state[4];
  uVar6 = (check->state).sha256.state[5];
  uVar7 = (check->state).sha256.state[6];
  uVar8 = (check->state).sha256.state[7];
  uVar9 = (uVar5 << 0x12 | uVar5 >> 0xe) ^ uVar5;
  uVar10 = (uVar9 << 0x1b | uVar9 >> 5) ^ uVar5;
  uVar9 = (check->buffer).u32[0];
  uVar18 = (check->buffer).u32[1];
  uVar20 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
  iVar13 = ((uVar7 ^ uVar6) & uVar5 ^ uVar7) + uVar8 + (uVar10 << 0x1a | uVar10 >> 6);
  uVar16 = uVar4 + iVar13 + uVar20 + 0x428a2f98;
  uVar9 = (uVar1 << 0x17 | uVar1 >> 9) ^ uVar1;
  uVar9 = (uVar9 << 0x15 | uVar9 >> 0xb) ^ uVar1;
  uVar11 = (uVar3 & uVar2) + ((uVar3 ^ uVar2) & uVar1) + (uVar9 << 0x1e | uVar9 >> 2) +
           uVar20 + iVar13 + 0x428a2f98;
  uVar9 = (uVar16 * 0x40000 | uVar16 >> 0xe) ^ uVar16;
  uVar24 = uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 | uVar18 << 0x18;
  iVar13 = ((uVar6 ^ uVar5) & uVar16 ^ uVar6) + uVar7 + uVar24;
  uVar9 = (uVar9 << 0x1b | uVar9 >> 5) ^ uVar16;
  uVar9 = uVar9 << 0x1a | uVar9 >> 6;
  uVar18 = (uVar11 * 0x800000 | uVar11 >> 9) ^ uVar11;
  uVar22 = uVar3 + iVar13 + uVar9 + 0x71374491;
  uVar18 = (uVar18 << 0x15 | uVar18 >> 0xb) ^ uVar11;
  uVar10 = (uVar22 * 0x40000 | uVar22 >> 0xe) ^ uVar22;
  uVar10 = (uVar10 << 0x1b | uVar10 >> 5) ^ uVar22;
  uVar21 = uVar10 << 0x1a | uVar10 >> 6;
  uVar14 = (uVar2 & uVar1) + ((uVar2 ^ uVar1) & uVar11) + (uVar18 << 0x1e | uVar18 >> 2) +
           uVar9 + iVar13 + 0x71374491;
  uVar9 = (check->buffer).u32[2];
  uVar10 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
  iVar13 = ((uVar16 ^ uVar5) & uVar22 ^ uVar5) + uVar10 + uVar6;
  uVar9 = (uVar14 * 0x800000 | uVar14 >> 9) ^ uVar14;
  uVar9 = (uVar9 << 0x15 | uVar9 >> 0xb) ^ uVar14;
  uVar12 = (uVar11 & uVar1) + ((uVar11 ^ uVar1) & uVar14) + (uVar9 << 0x1e | uVar9 >> 2) +
           uVar21 + iVar13 + -0x4a3f0431;
  uVar25 = uVar2 + iVar13 + uVar21 + 0xb5c0fbcf;
  uVar9 = (check->buffer).u32[3];
  uVar18 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
  iVar13 = ((uVar22 ^ uVar16) & uVar25 ^ uVar16) + uVar18 + uVar5;
  uVar9 = (uVar25 * 0x40000 | uVar25 >> 0xe) ^ uVar25;
  uVar9 = (uVar9 << 0x1b | uVar9 >> 5) ^ uVar25;
  uVar21 = uVar9 << 0x1a | uVar9 >> 6;
  uVar9 = (uVar12 * 0x800000 | uVar12 >> 9) ^ uVar12;
  uVar9 = (uVar9 << 0x15 | uVar9 >> 0xb) ^ uVar12;
  uVar28 = iVar13 + uVar21 + uVar1 + 0xe9b5dba5;
  uVar30 = (uVar14 & uVar11) + ((uVar14 ^ uVar11) & uVar12) + (uVar9 << 0x1e | uVar9 >> 2) +
           uVar21 + iVar13 + -0x164a245b;
  uVar9 = (check->buffer).u32[4];
  local_c0 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
  uVar9 = (uVar28 * 0x40000 | uVar28 >> 0xe) ^ uVar28;
  uVar9 = (uVar9 << 0x1b | uVar9 >> 5) ^ uVar28;
  iVar13 = uVar16 + local_c0 + ((uVar25 ^ uVar22) & uVar28 ^ uVar22) + (uVar9 << 0x1a | uVar9 >> 6)
           + 0x3956c25b;
  uVar9 = (uVar30 * 0x800000 | uVar30 >> 9) ^ uVar30;
  uVar9 = (uVar9 << 0x15 | uVar9 >> 0xb) ^ uVar30;
  uVar11 = uVar11 + iVar13;
  uVar21 = (uVar12 & uVar14) + ((uVar12 ^ uVar14) & uVar30) + (uVar9 << 0x1e | uVar9 >> 2) + iVar13;
  uVar9 = (check->buffer).u32[5];
  local_c4 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
  uVar9 = (uVar11 * 0x40000 | uVar11 >> 0xe) ^ uVar11;
  uVar9 = (uVar9 << 0x1b | uVar9 >> 5) ^ uVar11;
  iVar13 = (uVar9 << 0x1a | uVar9 >> 6) + uVar22 + local_c4 + ((uVar28 ^ uVar25) & uVar11 ^ uVar25)
           + 0x59f111f1;
  uVar9 = (uVar21 * 0x800000 | uVar21 >> 9) ^ uVar21;
  uVar9 = (uVar9 << 0x15 | uVar9 >> 0xb) ^ uVar21;
  uVar14 = uVar14 + iVar13;
  uVar32 = (uVar30 & uVar12) + ((uVar30 ^ uVar12) & uVar21) + (uVar9 << 0x1e | uVar9 >> 2) + iVar13;
  uVar9 = (check->buffer).u32[6];
  local_cc = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
  uVar9 = (uVar14 * 0x40000 | uVar14 >> 0xe) ^ uVar14;
  uVar9 = (uVar9 << 0x1b | uVar9 >> 5) ^ uVar14;
  iVar13 = uVar25 + local_cc + ((uVar11 ^ uVar28) & uVar14 ^ uVar28) + (uVar9 << 0x1a | uVar9 >> 6)
           + -0x6dc07d5c;
  uVar9 = (uVar32 * 0x800000 | uVar32 >> 9) ^ uVar32;
  uVar9 = (uVar9 << 0x15 | uVar9 >> 0xb) ^ uVar32;
  uVar12 = uVar12 + iVar13;
  uVar16 = (uVar21 & uVar30) + ((uVar21 ^ uVar30) & uVar32) + (uVar9 << 0x1e | uVar9 >> 2) + iVar13;
  uVar9 = (check->buffer).u32[7];
  local_ac = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
  uVar9 = (uVar12 * 0x40000 | uVar12 >> 0xe) ^ uVar12;
  uVar9 = (uVar9 << 0x1b | uVar9 >> 5) ^ uVar12;
  iVar13 = uVar28 + local_ac + ((uVar14 ^ uVar11) & uVar12 ^ uVar11) + (uVar9 << 0x1a | uVar9 >> 6)
           + -0x54e3a12b;
  uVar9 = (uVar16 * 0x800000 | uVar16 >> 9) ^ uVar16;
  uVar9 = (uVar9 << 0x15 | uVar9 >> 0xb) ^ uVar16;
  uVar30 = uVar30 + iVar13;
  uVar22 = (uVar32 & uVar21) + ((uVar32 ^ uVar21) & uVar16) + (uVar9 << 0x1e | uVar9 >> 2) + iVar13;
  uVar9 = (check->buffer).u32[8];
  local_e0 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
  uVar9 = (uVar30 * 0x40000 | uVar30 >> 0xe) ^ uVar30;
  uVar9 = (uVar9 << 0x1b | uVar9 >> 5) ^ uVar30;
  iVar13 = uVar11 + local_e0 + ((uVar12 ^ uVar14) & uVar30 ^ uVar14) + (uVar9 << 0x1a | uVar9 >> 6)
           + -0x27f85568;
  uVar9 = (uVar22 * 0x800000 | uVar22 >> 9) ^ uVar22;
  uVar9 = (uVar9 << 0x15 | uVar9 >> 0xb) ^ uVar22;
  uVar21 = uVar21 + iVar13;
  uVar25 = (uVar16 & uVar32) + ((uVar16 ^ uVar32) & uVar22) + (uVar9 << 0x1e | uVar9 >> 2) + iVar13;
  uVar9 = (check->buffer).u32[9];
  local_f4 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
  uVar9 = (uVar21 * 0x40000 | uVar21 >> 0xe) ^ uVar21;
  uVar9 = (uVar9 << 0x1b | uVar9 >> 5) ^ uVar21;
  iVar13 = (uVar9 << 0x1a | uVar9 >> 6) + uVar14 + local_f4 + ((uVar30 ^ uVar12) & uVar21 ^ uVar12)
           + 0x12835b01;
  uVar9 = (uVar25 * 0x800000 | uVar25 >> 9) ^ uVar25;
  uVar9 = (uVar9 << 0x15 | uVar9 >> 0xb) ^ uVar25;
  uVar32 = uVar32 + iVar13;
  uVar34 = (uVar22 & uVar16) + ((uVar22 ^ uVar16) & uVar25) + (uVar9 << 0x1e | uVar9 >> 2) + iVar13;
  uVar9 = (check->buffer).u32[10];
  local_f0 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
  uVar9 = (uVar32 * 0x40000 | uVar32 >> 0xe) ^ uVar32;
  uVar9 = (uVar9 << 0x1b | uVar9 >> 5) ^ uVar32;
  iVar13 = (uVar9 << 0x1a | uVar9 >> 6) + uVar12 + local_f0 + ((uVar21 ^ uVar30) & uVar32 ^ uVar30)
           + 0x243185be;
  uVar9 = (uVar34 * 0x800000 | uVar34 >> 9) ^ uVar34;
  uVar9 = (uVar9 << 0x15 | uVar9 >> 0xb) ^ uVar34;
  uVar16 = uVar16 + iVar13;
  uVar14 = (uVar25 & uVar22) + ((uVar25 ^ uVar22) & uVar34) + (uVar9 << 0x1e | uVar9 >> 2) + iVar13;
  uVar9 = (check->buffer).u32[0xb];
  local_b4 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
  uVar9 = (uVar16 * 0x40000 | uVar16 >> 0xe) ^ uVar16;
  uVar9 = (uVar9 << 0x1b | uVar9 >> 5) ^ uVar16;
  iVar13 = (uVar9 << 0x1a | uVar9 >> 6) + uVar30 + local_b4 + ((uVar32 ^ uVar21) & uVar16 ^ uVar21)
           + 0x550c7dc3;
  uVar9 = (uVar14 * 0x800000 | uVar14 >> 9) ^ uVar14;
  uVar9 = (uVar9 << 0x15 | uVar9 >> 0xb) ^ uVar14;
  uVar22 = uVar22 + iVar13;
  uVar28 = (uVar34 & uVar25) + ((uVar34 ^ uVar25) & uVar14) + (uVar9 << 0x1e | uVar9 >> 2) + iVar13;
  uVar9 = (check->buffer).u32[0xc];
  local_e8 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
  uVar9 = (uVar22 * 0x40000 | uVar22 >> 0xe) ^ uVar22;
  uVar9 = (uVar9 << 0x1b | uVar9 >> 5) ^ uVar22;
  iVar13 = (uVar9 << 0x1a | uVar9 >> 6) + uVar21 + local_e8 + ((uVar16 ^ uVar32) & uVar22 ^ uVar32)
           + 0x72be5d74;
  uVar9 = (uVar28 * 0x800000 | uVar28 >> 9) ^ uVar28;
  uVar9 = (uVar9 << 0x15 | uVar9 >> 0xb) ^ uVar28;
  uVar25 = uVar25 + iVar13;
  uVar12 = (uVar14 & uVar34) + ((uVar14 ^ uVar34) & uVar28) + (uVar9 << 0x1e | uVar9 >> 2) + iVar13;
  uVar9 = (check->buffer).u32[0xd];
  local_e4 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
  uVar9 = (uVar25 * 0x40000 | uVar25 >> 0xe) ^ uVar25;
  uVar9 = (uVar9 << 0x1b | uVar9 >> 5) ^ uVar25;
  iVar13 = (uVar9 << 0x1a | uVar9 >> 6) + uVar32 + local_e4 + ((uVar22 ^ uVar16) & uVar25 ^ uVar16)
           + -0x7f214e02;
  uVar9 = (uVar12 * 0x800000 | uVar12 >> 9) ^ uVar12;
  uVar9 = (uVar9 << 0x15 | uVar9 >> 0xb) ^ uVar12;
  uVar34 = uVar34 + iVar13;
  local_dc = (uVar28 & uVar14) + ((uVar28 ^ uVar14) & uVar12) + (uVar9 << 0x1e | uVar9 >> 2) +
             iVar13;
  uVar9 = (check->buffer).u32[0xe];
  uVar11 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
  uVar9 = (uVar34 * 0x40000 | uVar34 >> 0xe) ^ uVar34;
  uVar9 = (uVar9 << 0x1b | uVar9 >> 5) ^ uVar34;
  iVar13 = (uVar9 << 0x1a | uVar9 >> 6) + uVar16 + uVar11 + ((uVar25 ^ uVar22) & uVar34 ^ uVar22) +
           -0x6423f959;
  uVar9 = (local_dc * 0x800000 | local_dc >> 9) ^ local_dc;
  uVar9 = (uVar9 << 0x15 | uVar9 >> 0xb) ^ local_dc;
  uVar14 = uVar14 + iVar13;
  local_d0 = (uVar12 & uVar28) + ((uVar12 ^ uVar28) & local_dc) + (uVar9 << 0x1e | uVar9 >> 2) +
             iVar13;
  uVar9 = (check->buffer).u32[0xf];
  local_ec = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
  uVar9 = (uVar14 * 0x40000 | uVar14 >> 0xe) ^ uVar14;
  uVar9 = (uVar9 << 0x1b | uVar9 >> 5) ^ uVar14;
  iVar13 = (uVar9 << 0x1a | uVar9 >> 6) + uVar22 + local_ec + ((uVar34 ^ uVar25) & uVar14 ^ uVar25)
           + -0x3e640e8c;
  uVar9 = (local_d0 * 0x800000 | local_d0 >> 9) ^ local_d0;
  uVar9 = (uVar9 << 0x15 | uVar9 >> 0xb) ^ local_d0;
  uVar28 = uVar28 + iVar13;
  uVar9 = (local_dc & uVar12) + ((local_dc ^ uVar12) & local_d0) + (uVar9 << 0x1e | uVar9 >> 2) +
          iVar13;
  for (uVar23 = 0x10; uVar23 < 0x40; uVar23 = uVar23 + 0x10) {
    uVar16 = (uVar11 << 0x1e | uVar11 >> 2) ^ uVar11;
    uVar21 = (uVar24 << 0x15 | uVar24 >> 0xb) ^ uVar24;
    uVar20 = uVar20 + local_f4 + (uVar11 >> 10 ^ (uVar16 << 0xf | uVar16 >> 0x11)) +
             (uVar24 >> 3 ^ (uVar21 << 0x19 | uVar21 >> 7));
    uVar16 = (uVar28 << 0x12 | uVar28 >> 0xe) ^ uVar28;
    uVar16 = (uVar16 << 0x1b | uVar16 >> 5) ^ uVar28;
    iVar13 = uVar25 + ((uVar14 ^ uVar34) & uVar28 ^ uVar34) + uVar20 +
             (uVar16 << 0x1a | uVar16 >> 6) + SHA256_K[uVar23];
    uVar16 = (uVar9 << 0x17 | uVar9 >> 9) ^ uVar9;
    uVar16 = (uVar16 << 0x15 | uVar16 >> 0xb) ^ uVar9;
    uVar12 = uVar12 + iVar13;
    uVar21 = (local_ec << 0x1e | local_ec >> 2) ^ local_ec;
    uVar17 = (local_d0 & local_dc) + ((local_d0 ^ local_dc) & uVar9) +
             (uVar16 << 0x1e | uVar16 >> 2) + iVar13;
    uVar16 = (uVar10 << 0x15 | uVar10 >> 0xb) ^ uVar10;
    uVar22 = (uVar12 * 0x40000 | uVar12 >> 0xe) ^ uVar12;
    uVar22 = (uVar22 << 0x1b | uVar22 >> 5) ^ uVar12;
    uVar24 = uVar24 + local_f0 + (local_ec >> 10 ^ (uVar21 << 0xf | uVar21 >> 0x11)) +
             (uVar10 >> 3 ^ (uVar16 << 0x19 | uVar16 >> 7));
    iVar13 = uVar34 + uVar24 + SHA256_K[uVar23 + 1] + ((uVar28 ^ uVar14) & uVar12 ^ uVar14) +
             (uVar22 << 0x1a | uVar22 >> 6);
    uVar16 = (uVar17 * 0x800000 | uVar17 >> 9) ^ uVar17;
    uVar16 = (uVar16 << 0x15 | uVar16 >> 0xb) ^ uVar17;
    local_dc = local_dc + iVar13;
    uVar34 = (uVar9 & local_d0) + ((uVar9 ^ local_d0) & uVar17) + (uVar16 << 0x1e | uVar16 >> 2) +
             iVar13;
    uVar16 = (uVar20 * 0x40000000 | uVar20 >> 2) ^ uVar20;
    uVar21 = (uVar18 << 0x15 | uVar18 >> 0xb) ^ uVar18;
    uVar10 = uVar10 + local_b4 + (uVar18 >> 3 ^ (uVar21 << 0x19 | uVar21 >> 7)) +
             (uVar20 >> 10 ^ (uVar16 << 0xf | uVar16 >> 0x11));
    uVar16 = (local_dc * 0x40000 | local_dc >> 0xe) ^ local_dc;
    uVar16 = (uVar16 << 0x1b | uVar16 >> 5) ^ local_dc;
    iVar13 = uVar14 + uVar10 + SHA256_K[uVar23 + 2] + ((uVar12 ^ uVar28) & local_dc ^ uVar28) +
             (uVar16 << 0x1a | uVar16 >> 6);
    uVar14 = (uVar34 * 0x800000 | uVar34 >> 9) ^ uVar34;
    uVar14 = (uVar14 << 0x15 | uVar14 >> 0xb) ^ uVar34;
    local_d0 = local_d0 + iVar13;
    uVar21 = (uVar17 & uVar9) + ((uVar17 ^ uVar9) & uVar34) + (uVar14 << 0x1e | uVar14 >> 2) +
             iVar13;
    uVar14 = (uVar24 * 0x40000000 | uVar24 >> 2) ^ uVar24;
    uVar16 = (local_c0 << 0x15 | local_c0 >> 0xb) ^ local_c0;
    uVar18 = uVar18 + local_e8 + (local_c0 >> 3 ^ (uVar16 << 0x19 | uVar16 >> 7)) +
             (uVar24 >> 10 ^ (uVar14 << 0xf | uVar14 >> 0x11));
    uVar14 = (local_d0 * 0x40000 | local_d0 >> 0xe) ^ local_d0;
    uVar14 = (uVar14 << 0x1b | uVar14 >> 5) ^ local_d0;
    iVar13 = uVar28 + uVar18 + SHA256_K[uVar23 + 3] + ((local_dc ^ uVar12) & local_d0 ^ uVar12) +
             (uVar14 << 0x1a | uVar14 >> 6);
    uVar14 = (uVar21 * 0x800000 | uVar21 >> 9) ^ uVar21;
    uVar14 = (uVar14 << 0x15 | uVar14 >> 0xb) ^ uVar21;
    uVar9 = uVar9 + iVar13;
    uVar15 = (uVar34 & uVar17) + ((uVar34 ^ uVar17) & uVar21) + (uVar14 << 0x1e | uVar14 >> 2) +
             iVar13;
    uVar14 = (uVar10 * 0x40000000 | uVar10 >> 2) ^ uVar10;
    uVar16 = (local_c4 << 0x15 | local_c4 >> 0xb) ^ local_c4;
    uVar22 = (uVar9 * 0x40000 | uVar9 >> 0xe) ^ uVar9;
    local_c0 = local_c0 + local_e4 + (local_c4 >> 3 ^ (uVar16 << 0x19 | uVar16 >> 7)) +
               (uVar10 >> 10 ^ (uVar14 << 0xf | uVar14 >> 0x11));
    uVar14 = (uVar22 << 0x1b | uVar22 >> 5) ^ uVar9;
    iVar13 = uVar12 + local_c0 + SHA256_K[uVar23 + 4] + ((local_d0 ^ local_dc) & uVar9 ^ local_dc) +
             (uVar14 << 0x1a | uVar14 >> 6);
    uVar12 = (uVar15 * 0x800000 | uVar15 >> 9) ^ uVar15;
    uVar12 = (uVar12 << 0x15 | uVar12 >> 0xb) ^ uVar15;
    uVar17 = uVar17 + iVar13;
    uVar14 = (uVar18 * 0x40000000 | uVar18 >> 2) ^ uVar18;
    uVar16 = (uVar21 & uVar34) + ((uVar21 ^ uVar34) & uVar15) + (uVar12 << 0x1e | uVar12 >> 2) +
             iVar13;
    uVar12 = (local_cc << 0x15 | local_cc >> 0xb) ^ local_cc;
    local_c4 = local_c4 + uVar11 + (local_cc >> 3 ^ (uVar12 << 0x19 | uVar12 >> 7)) +
               (uVar18 >> 10 ^ (uVar14 << 0xf | uVar14 >> 0x11));
    uVar12 = (uVar17 * 0x40000 | uVar17 >> 0xe) ^ uVar17;
    uVar12 = (uVar12 << 0x1b | uVar12 >> 5) ^ uVar17;
    iVar13 = SHA256_K[uVar23 + 5] + local_c4 + local_dc + ((uVar9 ^ local_d0) & uVar17 ^ local_d0) +
             (uVar12 << 0x1a | uVar12 >> 6);
    uVar12 = (uVar16 * 0x800000 | uVar16 >> 9) ^ uVar16;
    uVar14 = (uVar12 << 0x15 | uVar12 >> 0xb) ^ uVar16;
    uVar12 = (local_c0 * 0x40000000 | local_c0 >> 2) ^ local_c0;
    uVar26 = (local_ac << 0x15 | local_ac >> 0xb) ^ local_ac;
    uVar25 = (local_e0 << 0x15 | local_e0 >> 0xb) ^ local_e0;
    uVar34 = uVar34 + iVar13;
    uVar33 = (uVar15 & uVar21) + ((uVar15 ^ uVar21) & uVar16) + (uVar14 << 0x1e | uVar14 >> 2) +
             iVar13;
    uVar14 = (local_f4 << 0x15 | local_f4 >> 0xb) ^ local_f4;
    uVar31 = (local_f0 << 0x15 | local_f0 >> 0xb) ^ local_f0;
    uVar22 = (uVar20 * 0x200000 | uVar20 >> 0xb) ^ uVar20;
    uVar27 = (local_b4 << 0x15 | local_b4 >> 0xb) ^ local_b4;
    uVar30 = (local_ec << 0x15 | local_ec >> 0xb) ^ local_ec;
    uVar28 = (local_e8 << 0x15 | local_e8 >> 0xb) ^ local_e8;
    uVar32 = (uVar11 << 0x15 | uVar11 >> 0xb) ^ uVar11;
    uVar19 = (local_e4 << 0x15 | local_e4 >> 0xb) ^ local_e4;
    local_cc = local_cc + local_ec + (local_ac >> 3 ^ (uVar26 << 0x19 | uVar26 >> 7)) +
               (local_c0 >> 10 ^ (uVar12 << 0xf | uVar12 >> 0x11));
    uVar12 = (uVar34 * 0x40000 | uVar34 >> 0xe) ^ uVar34;
    uVar12 = (uVar12 << 0x1b | uVar12 >> 5) ^ uVar34;
    iVar13 = SHA256_K[uVar23 + 6] + local_cc + local_d0 + ((uVar17 ^ uVar9) & uVar34 ^ uVar9) +
             (uVar12 << 0x1a | uVar12 >> 6);
    uVar12 = (uVar33 * 0x800000 | uVar33 >> 9) ^ uVar33;
    uVar12 = (uVar12 << 0x15 | uVar12 >> 0xb) ^ uVar33;
    uVar21 = uVar21 + iVar13;
    uVar29 = (local_c4 * 0x40000000 | local_c4 >> 2) ^ local_c4;
    uVar26 = (uVar16 & uVar15) + ((uVar16 ^ uVar15) & uVar33) + (uVar12 << 0x1e | uVar12 >> 2) +
             iVar13;
    local_ac = (local_e0 >> 3 ^ (uVar25 << 0x19 | uVar25 >> 7)) + local_ac + uVar20 +
               (local_c4 >> 10 ^ (uVar29 << 0xf | uVar29 >> 0x11));
    uVar12 = (uVar21 * 0x40000 | uVar21 >> 0xe) ^ uVar21;
    uVar12 = (uVar12 << 0x1b | uVar12 >> 5) ^ uVar21;
    iVar13 = SHA256_K[uVar23 + 7] + local_ac + uVar9 + ((uVar34 ^ uVar17) & uVar21 ^ uVar17) +
             (uVar12 << 0x1a | uVar12 >> 6);
    uVar9 = (uVar26 * 0x800000 | uVar26 >> 9) ^ uVar26;
    uVar9 = (uVar9 << 0x15 | uVar9 >> 0xb) ^ uVar26;
    uVar15 = uVar15 + iVar13;
    uVar29 = (uVar33 & uVar16) + ((uVar33 ^ uVar16) & uVar26) + (uVar9 << 0x1e | uVar9 >> 2) +
             iVar13;
    uVar9 = (local_cc * 0x40000000 | local_cc >> 2) ^ local_cc;
    local_e0 = (local_f4 >> 3 ^ (uVar14 << 0x19 | uVar14 >> 7)) + local_e0 + uVar24 +
               (local_cc >> 10 ^ (uVar9 << 0xf | uVar9 >> 0x11));
    uVar9 = (uVar15 * 0x40000 | uVar15 >> 0xe) ^ uVar15;
    uVar9 = (uVar9 << 0x1b | uVar9 >> 5) ^ uVar15;
    iVar13 = SHA256_K[uVar23 + 8] + local_e0 + uVar17 + ((uVar21 ^ uVar34) & uVar15 ^ uVar34) +
             (uVar9 << 0x1a | uVar9 >> 6);
    uVar9 = (uVar29 * 0x800000 | uVar29 >> 9) ^ uVar29;
    uVar9 = (uVar9 << 0x15 | uVar9 >> 0xb) ^ uVar29;
    uVar16 = uVar16 + iVar13;
    uVar25 = (uVar26 & uVar33) + ((uVar26 ^ uVar33) & uVar29) + (uVar9 << 0x1e | uVar9 >> 2) +
             iVar13;
    uVar9 = (local_ac * 0x40000000 | local_ac >> 2) ^ local_ac;
    local_f4 = (local_f0 >> 3 ^ (uVar31 << 0x19 | uVar31 >> 7)) + local_f4 + uVar10 +
               (local_ac >> 10 ^ (uVar9 << 0xf | uVar9 >> 0x11));
    uVar9 = (uVar16 * 0x40000 | uVar16 >> 0xe) ^ uVar16;
    uVar9 = (uVar9 << 0x1b | uVar9 >> 5) ^ uVar16;
    iVar13 = SHA256_K[uVar23 + 9] + local_f4 + uVar34 + ((uVar15 ^ uVar21) & uVar16 ^ uVar21) +
             (uVar9 << 0x1a | uVar9 >> 6);
    uVar9 = (uVar25 * 0x800000 | uVar25 >> 9) ^ uVar25;
    uVar9 = (uVar9 << 0x15 | uVar9 >> 0xb) ^ uVar25;
    uVar33 = uVar33 + iVar13;
    uVar34 = (uVar29 & uVar26) + ((uVar29 ^ uVar26) & uVar25) + (uVar9 << 0x1e | uVar9 >> 2) +
             iVar13;
    uVar9 = (local_e0 * 0x40000000 | local_e0 >> 2) ^ local_e0;
    local_f0 = (local_b4 >> 3 ^ (uVar27 << 0x19 | uVar27 >> 7)) + local_f0 + uVar18 +
               (local_e0 >> 10 ^ (uVar9 << 0xf | uVar9 >> 0x11));
    uVar9 = (uVar33 * 0x40000 | uVar33 >> 0xe) ^ uVar33;
    uVar9 = (uVar9 << 0x1b | uVar9 >> 5) ^ uVar33;
    iVar13 = SHA256_K[uVar23 + 10] + local_f0 + uVar21 + ((uVar16 ^ uVar15) & uVar33 ^ uVar15) +
             (uVar9 << 0x1a | uVar9 >> 6);
    uVar9 = (uVar34 * 0x800000 | uVar34 >> 9) ^ uVar34;
    uVar12 = (uVar9 << 0x15 | uVar9 >> 0xb) ^ uVar34;
    uVar26 = uVar26 + iVar13;
    uVar9 = (local_f4 * 0x40000000 | local_f4 >> 2) ^ local_f4;
    uVar14 = (uVar25 & uVar29) + ((uVar25 ^ uVar29) & uVar34) + (uVar12 << 0x1e | uVar12 >> 2) +
             iVar13;
    local_b4 = (local_e8 >> 3 ^ (uVar28 << 0x19 | uVar28 >> 7)) + local_b4 + local_c0 +
               (local_f4 >> 10 ^ (uVar9 << 0xf | uVar9 >> 0x11));
    uVar9 = (uVar26 * 0x40000 | uVar26 >> 0xe) ^ uVar26;
    uVar9 = (uVar9 << 0x1b | uVar9 >> 5) ^ uVar26;
    iVar13 = SHA256_K[uVar23 + 0xb] + local_b4 + uVar15 + ((uVar33 ^ uVar16) & uVar26 ^ uVar16) +
             (uVar9 << 0x1a | uVar9 >> 6);
    uVar9 = (uVar14 * 0x800000 | uVar14 >> 9) ^ uVar14;
    uVar9 = (uVar9 << 0x15 | uVar9 >> 0xb) ^ uVar14;
    uVar29 = uVar29 + iVar13;
    uVar28 = (uVar34 & uVar25) + ((uVar34 ^ uVar25) & uVar14) + (uVar9 << 0x1e | uVar9 >> 2) +
             iVar13;
    uVar9 = (local_f0 * 0x40000000 | local_f0 >> 2) ^ local_f0;
    local_e8 = (local_e4 >> 3 ^ (uVar19 << 0x19 | uVar19 >> 7)) + local_e8 + local_c4 +
               (local_f0 >> 10 ^ (uVar9 << 0xf | uVar9 >> 0x11));
    uVar9 = (uVar29 * 0x40000 | uVar29 >> 0xe) ^ uVar29;
    uVar9 = (uVar9 << 0x1b | uVar9 >> 5) ^ uVar29;
    iVar13 = SHA256_K[uVar23 + 0xc] + local_e8 + uVar16 + ((uVar26 ^ uVar33) & uVar29 ^ uVar33) +
             (uVar9 << 0x1a | uVar9 >> 6);
    uVar9 = (uVar28 * 0x800000 | uVar28 >> 9) ^ uVar28;
    uVar9 = (uVar9 << 0x15 | uVar9 >> 0xb) ^ uVar28;
    uVar25 = uVar25 + iVar13;
    uVar12 = (uVar14 & uVar34) + ((uVar14 ^ uVar34) & uVar28) + (uVar9 << 0x1e | uVar9 >> 2) +
             iVar13;
    uVar9 = (local_b4 * 0x40000000 | local_b4 >> 2) ^ local_b4;
    local_e4 = (uVar11 >> 3 ^ (uVar32 << 0x19 | uVar32 >> 7)) + local_e4 + local_cc +
               (local_b4 >> 10 ^ (uVar9 << 0xf | uVar9 >> 0x11));
    uVar9 = (uVar25 * 0x40000 | uVar25 >> 0xe) ^ uVar25;
    uVar9 = (uVar9 << 0x1b | uVar9 >> 5) ^ uVar25;
    iVar13 = SHA256_K[uVar23 + 0xd] + local_e4 + uVar33 + ((uVar29 ^ uVar26) & uVar25 ^ uVar26) +
             (uVar9 << 0x1a | uVar9 >> 6);
    uVar9 = (uVar12 * 0x800000 | uVar12 >> 9) ^ uVar12;
    uVar9 = (uVar9 << 0x15 | uVar9 >> 0xb) ^ uVar12;
    uVar34 = uVar34 + iVar13;
    local_dc = (uVar28 & uVar14) + ((uVar28 ^ uVar14) & uVar12) + (uVar9 << 0x1e | uVar9 >> 2) +
               iVar13;
    uVar9 = (local_e8 * 0x40000000 | local_e8 >> 2) ^ local_e8;
    uVar11 = (local_ec >> 3 ^ (uVar30 << 0x19 | uVar30 >> 7)) + uVar11 + local_ac +
             (local_e8 >> 10 ^ (uVar9 << 0xf | uVar9 >> 0x11));
    uVar9 = (uVar34 * 0x40000 | uVar34 >> 0xe) ^ uVar34;
    uVar9 = (uVar9 << 0x1b | uVar9 >> 5) ^ uVar34;
    iVar13 = SHA256_K[uVar23 + 0xe] + uVar11 + uVar26 + ((uVar25 ^ uVar29) & uVar34 ^ uVar29) +
             (uVar9 << 0x1a | uVar9 >> 6);
    uVar9 = (local_dc * 0x800000 | local_dc >> 9) ^ local_dc;
    uVar9 = (uVar9 << 0x15 | uVar9 >> 0xb) ^ local_dc;
    uVar14 = uVar14 + iVar13;
    uVar16 = (local_e4 * 0x40000000 | local_e4 >> 2) ^ local_e4;
    local_d0 = (uVar12 & uVar28) + ((uVar12 ^ uVar28) & local_dc) + (uVar9 << 0x1e | uVar9 >> 2) +
               iVar13;
    local_ec = (uVar20 >> 3 ^ (uVar22 << 0x19 | uVar22 >> 7)) + local_ec + local_e0 +
               (local_e4 >> 10 ^ (uVar16 << 0xf | uVar16 >> 0x11));
    uVar9 = (uVar14 * 0x40000 | uVar14 >> 0xe) ^ uVar14;
    uVar9 = (uVar9 << 0x1b | uVar9 >> 5) ^ uVar14;
    iVar13 = SHA256_K[uVar23 + 0xf] + local_ec + uVar29 + ((uVar34 ^ uVar25) & uVar14 ^ uVar25) +
             (uVar9 << 0x1a | uVar9 >> 6);
    uVar9 = (local_d0 * 0x800000 | local_d0 >> 9) ^ local_d0;
    uVar9 = (uVar9 << 0x15 | uVar9 >> 0xb) ^ local_d0;
    uVar28 = uVar28 + iVar13;
    uVar9 = (local_dc & uVar12) + ((local_dc ^ uVar12) & local_d0) + (uVar9 << 0x1e | uVar9 >> 2) +
            iVar13;
  }
  (check->state).crc32 = uVar9 + uVar1;
  (check->state).sha256.state[1] = local_d0 + uVar2;
  (check->state).sha256.state[2] = local_dc + uVar3;
  (check->state).sha256.state[3] = uVar12 + uVar4;
  (check->state).sha256.state[4] = uVar28 + uVar5;
  (check->state).sha256.state[5] = uVar14 + uVar6;
  (check->state).sha256.state[6] = uVar34 + uVar7;
  (check->state).sha256.state[7] = uVar25 + uVar8;
  return;
}

Assistant:

static void
transform(uint32_t state[8], const uint32_t data[16])
{
	uint32_t W[16];
	uint32_t T[8];

	// Copy state[] to working vars.
	memcpy(T, state, sizeof(T));

	// The first 16 operations unrolled
	R0( 0); R0( 1); R0( 2); R0( 3);
	R0( 4); R0( 5); R0( 6); R0( 7);
	R0( 8); R0( 9); R0(10); R0(11);
	R0(12); R0(13); R0(14); R0(15);

	// The remaining 48 operations partially unrolled
	for (unsigned int j = 16; j < 64; j += 16) {
		R2( 0); R2( 1); R2( 2); R2( 3);
		R2( 4); R2( 5); R2( 6); R2( 7);
		R2( 8); R2( 9); R2(10); R2(11);
		R2(12); R2(13); R2(14); R2(15);
	}

	// Add the working vars back into state[].
	state[0] += a(0);
	state[1] += b(0);
	state[2] += c(0);
	state[3] += d(0);
	state[4] += e(0);
	state[5] += f(0);
	state[6] += g(0);
	state[7] += h(0);
}